

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-load.c
# Opt level: O0

ztresult_t
zt_load(ztstruct_t *meta,void *structure,char *filename,ztregion_t *regions,int nregions,
       ztloader_t **loaders,int nloaders,char **syntax_error)

{
  ztast_t *pzVar1;
  size_t sVar2;
  void *pvVar3;
  long *in_stack_00000010;
  size_t len;
  char errbuf [100];
  ztast_t *ast;
  ztresult_t rc;
  ztloader_t **in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  int nregions_00;
  char in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff59;
  ztstruct_t *in_stack_ffffffffffffff60;
  ztast_t *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  int local_34;
  
  nregions_00 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  memset(&stack0xffffffffffffff58,0,100);
  *in_stack_00000010 = 0;
  pzVar1 = ztast_from_file(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (pzVar1 == (ztast_t *)0x0) {
    local_34 = 0x70;
  }
  else {
    local_34 = zt_run_program(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                              (ztregion_t *)
                              CONCAT71(in_stack_ffffffffffffff59,in_stack_ffffffffffffff58),
                              nregions_00,in_stack_ffffffffffffff48,
                              (int)((ulong)&stack0xffffffffffffff58 >> 0x20),
                              in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
    ztast_destroy((ztast_t *)0x101766);
  }
  if ((local_34 != 0) && (in_stack_ffffffffffffff58 != '\0')) {
    sVar2 = strlen(&stack0xffffffffffffff58);
    sVar2 = sVar2 + 1;
    pvVar3 = malloc(sVar2);
    *in_stack_00000010 = (long)pvVar3;
    if (*in_stack_00000010 != 0) {
      memcpy((void *)*in_stack_00000010,&stack0xffffffffffffff58,sVar2);
    }
  }
  return local_34;
}

Assistant:

ztresult_t zt_load(const ztstruct_t  *meta,
                   void              *structure,
                   const char        *filename,
                   const ztregion_t  *regions,
                   int                nregions,
                   ztloader_t       **loaders,
                   int                nloaders,
                   char             **syntax_error)
{
  ztresult_t rc;
  ztast_t   *ast;
  char       errbuf[ZTMAXERRBUF] = "";

  assert(meta);
  assert(structure);
  assert(filename);
  /* regions may be NULL */
  assert(nregions >= 0);
  assert(syntax_error);

  *syntax_error = NULL;

  ast = ztast_from_file(filename, errbuf);
  if (ast == NULL)
  {
    rc = ztresult_PARSE_FAIL;
    goto exit;
  }

  rc = zt_run_program(ast,
                      meta,
                      regions,
                      nregions,
                      loaders,
                      nloaders,
                      structure,
                      errbuf);

  ztast_destroy(ast);

exit:
  if (rc && errbuf[0])
  {
    size_t len;

    len = strlen(errbuf) + 1;
    *syntax_error = malloc(len);
    if (*syntax_error)
      memcpy(*syntax_error, errbuf, len);
  }

  return rc;
}